

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::MultiPartInputFile::Data::~Data(Data *this)

{
  IStream *pIVar1;
  pointer ppIVar2;
  InputPartData *this_00;
  size_t i;
  ulong uVar3;
  
  if ((this->deleteStream == true) &&
     (pIVar1 = (this->super_InputStreamMutex).is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
  }
  for (uVar3 = 0;
      ppIVar2 = (this->parts).
                super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->parts).
                            super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppIVar2[uVar3];
    if (this_00 != (InputPartData *)0x0) {
      InputPartData::~InputPartData(this_00);
    }
    operator_delete(this_00,0x70);
  }
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&this->_headers);
  std::
  _Rb_tree<int,_std::pair<const_int,_Imf_2_5::GenericInputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  ::~_Rb_tree(&(this->_inputFiles)._M_t);
  std::_Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
  ~_Vector_base(&(this->parts).
                 super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
               );
  return;
}

Assistant:

~Data()
    {
        if (deleteStream) delete is;

        for (size_t i = 0; i < parts.size(); i++)
            delete parts[i];
    }